

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopContinueBreakLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,0,0);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,0,0);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar1 = Result::good(&r);
  if ((bVar1) && (this->loopStackDepth == 0)) {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    if (layer->_oneof_case_[0] == 0x26c) {
      std::__cxx11::string::string((string *)&local_a8,(string *)(layer->name_).ptr_);
      std::operator+(&local_88,"Loop Break Layer \'",&local_a8);
      std::operator+(&local_40,&local_88,"\' must be inside the bodyNetwork of a loop layer.");
    }
    else {
      std::__cxx11::string::string((string *)&local_a8,(string *)(layer->name_).ptr_);
      std::operator+(&local_88,"Loop Continue Layer \'",&local_a8);
      std::operator+(&local_40,&local_88,"\' must be inside the bodyNetwork of a loop layer.");
    }
    std::__cxx11::string::operator=((string *)&err,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopContinueBreakLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 0, 0);
    }
    if (!r.good()) {
        return r;
    }

    if (loopStackDepth == 0) {
        std::string err;
        if (layer.layer_case() == Specification::NeuralNetworkLayer::LayerCase::kLoopBreak) {
            err = "Loop Break Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        } else {
            err = "Loop Continue Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        }
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}